

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utColladaExportCamera.cpp
# Opt level: O0

void __thiscall
ColladaExportCamera_testExportCamera_Test::TestBody(ColladaExportCamera_testExportCamera_Test *this)

{
  float fVar1;
  undefined8 uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar4
  ;
  bool bVar5;
  char *pcVar6;
  char *pcVar7;
  float *pfVar8;
  aiString *__p;
  ulong uVar9;
  aiVector3t<float> *__p_00;
  type pfVar10;
  type paVar11;
  type paVar12;
  char *in_R9;
  aiVector3t<float> *local_380;
  aiString *local_358;
  AssertHelper local_2e8;
  Message local_2e0;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_10;
  Message local_2c0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_9;
  Message local_2a0;
  undefined1 local_298 [8];
  AssertionResult gtest_ar_8;
  Message local_280;
  undefined1 local_278 [8];
  AssertionResult gtest_ar_7;
  Message local_260;
  undefined1 local_258 [8];
  AssertionResult gtest_ar_6;
  Message local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_5;
  AssertHelper local_208;
  Message local_200;
  bool local_1f1;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__2;
  aiCamera *read;
  size_t i_1;
  Message local_1c8;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_4;
  AssertHelper local_190;
  Message local_188;
  bool local_179;
  undefined1 local_178 [8];
  AssertionResult gtest_ar__1;
  Message local_160;
  void *local_158;
  undefined1 local_150 [8];
  AssertionResult gtest_ar_3;
  aiScene *imported;
  Message local_130;
  void *local_128;
  undefined1 local_120 [8];
  AssertionResult gtest_ar_2;
  aiCamera *orig;
  size_t i;
  unique_ptr<aiVector3t<float>[],_std::default_delete<aiVector3t<float>[]>_> pos;
  unique_ptr<aiString[],_std::default_delete<aiString[]>_> names;
  unique_ptr<float[],_std::default_delete<float[]>_> orifClipPlaneFar;
  unique_ptr<float[],_std::default_delete<float[]>_> orifClipPlaneNear;
  unique_ptr<float[],_std::default_delete<float[]>_> origFOV;
  uint origNumCams;
  Message local_c8;
  aiReturn local_c0 [2];
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_88;
  Message local_80;
  bool local_71;
  undefined1 local_70 [8];
  AssertionResult gtest_ar_;
  AssertHelper local_58;
  Message local_50 [3];
  void *local_38;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  aiScene *pTest;
  char *file;
  ColladaExportCamera_testExportCamera_Test *this_local;
  
  gtest_ar.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       Assimp::Importer::ReadFile
                 ((this->super_ColladaExportCamera).im,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/models/Collada/cameras.dae"
                  ,0x400);
  local_38 = (void *)0x0;
  testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
            ((internal *)local_30,"nullptr","pTest",&local_38,(aiScene **)&gtest_ar.message_);
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar5) {
    testing::Message::Message(local_50);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              (&local_58,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
               ,0x4d,pcVar6);
    testing::internal::AssertHelper::operator=(&local_58,local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_58);
    testing::Message::~Message(local_50);
  }
  gtest_ar_.message_.ptr_._5_3_ = 0;
  gtest_ar_.message_.ptr_._4_1_ = !bVar5;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  if (gtest_ar_.message_.ptr_._4_4_ == 0) {
    local_71 = aiScene::HasCameras((aiScene *)gtest_ar.message_.ptr_);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_70,&local_71,(type *)0x0);
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_70);
    if (!bVar5) {
      testing::Message::Message(&local_80);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar_1.message_,(internal *)local_70,
                 (AssertionResult *)"pTest->HasCameras()","false","true",in_R9);
      pcVar6 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                 ,0x4e,pcVar6);
      testing::internal::AssertHelper::operator=(&local_88,&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_80);
    }
    gtest_ar_.message_.ptr_._5_3_ = 0;
    gtest_ar_.message_.ptr_._4_1_ = !bVar5;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_70);
    if (gtest_ar_.message_.ptr_._4_4_ == 0) {
      local_c0[1] = 0;
      pcVar6 = (char *)0x0;
      local_c0[0] = Assimp::Exporter::Export
                              ((this->super_ColladaExportCamera).ex,
                               (aiScene *)gtest_ar.message_.ptr_,"collada","cameraExp.dae",0,
                               (ExportProperties *)0x0);
      testing::internal::EqHelper<false>::Compare<aiReturn,aiReturn>
                ((EqHelper<false> *)local_b8,"aiReturn_SUCCESS","ex->Export(pTest,\"collada\",file)"
                 ,local_c0 + 1,local_c0);
      bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
      if (!bVar5) {
        testing::Message::Message(&local_c8);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_b8);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xffffffffffffff30,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                   ,0x51,pcVar7);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xffffffffffffff30,&local_c8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff30);
        testing::Message::~Message(&local_c8);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
      origFOV._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
      super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
      super__Head_base<0UL,_float_*,_false>._M_head_impl._4_4_ =
           *(uint *)(gtest_ar.message_.ptr_ + 3);
      pfVar8 = (float *)operator_new__((ulong)origFOV._M_t.
                                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                              .super__Head_base<0UL,_float_*,_false>._M_head_impl.
                                              _4_4_ << 2);
      std::unique_ptr<float[],std::default_delete<float[]>>::
      unique_ptr<float*,std::default_delete<float[]>,void,bool>
                ((unique_ptr<float[],std::default_delete<float[]>> *)&orifClipPlaneNear,pfVar8);
      pfVar8 = (float *)operator_new__((ulong)origFOV._M_t.
                                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                              .super__Head_base<0UL,_float_*,_false>._M_head_impl.
                                              _4_4_ << 2);
      std::unique_ptr<float[],std::default_delete<float[]>>::
      unique_ptr<float*,std::default_delete<float[]>,void,bool>
                ((unique_ptr<float[],std::default_delete<float[]>> *)&orifClipPlaneFar,pfVar8);
      pfVar8 = (float *)operator_new__((ulong)origFOV._M_t.
                                              super___uniq_ptr_impl<float,_std::default_delete<float[]>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>
                                              .super__Head_base<0UL,_float_*,_false>._M_head_impl.
                                              _4_4_ << 2);
      std::unique_ptr<float[],std::default_delete<float[]>>::
      unique_ptr<float*,std::default_delete<float[]>,void,bool>
                ((unique_ptr<float[],std::default_delete<float[]>> *)&names,pfVar8);
      uVar9 = (ulong)origFOV._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                     super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                     super__Head_base<0UL,_float_*,_false>._M_head_impl._4_4_;
      __p = (aiString *)operator_new__(uVar9 * 0x404);
      if (uVar9 != 0) {
        local_358 = __p;
        do {
          aiString::aiString(local_358);
          local_358 = local_358 + 1;
        } while (local_358 != __p + uVar9);
      }
      std::unique_ptr<aiString[],std::default_delete<aiString[]>>::
      unique_ptr<aiString*,std::default_delete<aiString[]>,void,bool>
                ((unique_ptr<aiString[],std::default_delete<aiString[]>> *)&pos,__p);
      uVar9 = (ulong)origFOV._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                     super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                     super__Head_base<0UL,_float_*,_false>._M_head_impl._4_4_;
      __p_00 = (aiVector3t<float> *)operator_new__(uVar9 * 0xc);
      if (uVar9 != 0) {
        local_380 = __p_00;
        do {
          aiVector3t<float>::aiVector3t(local_380);
          local_380 = local_380 + 1;
        } while (local_380 != __p_00 + uVar9);
      }
      std::unique_ptr<aiVector3t<float>[],std::default_delete<aiVector3t<float>[]>>::
      unique_ptr<aiVector3t<float>*,std::default_delete<aiVector3t<float>[]>,void,bool>
                ((unique_ptr<aiVector3t<float>[],std::default_delete<aiVector3t<float>[]>> *)&i,
                 __p_00);
      for (orig = (aiCamera *)0x0;
          orig < (aiCamera *)
                 (ulong)origFOV._M_t.super___uniq_ptr_impl<float,_std::default_delete<float[]>_>.
                        _M_t.super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                        super__Head_base<0UL,_float_*,_false>._M_head_impl._4_4_;
          orig = (aiCamera *)((long)&(orig->mName).length + 1)) {
        gtest_ar_2.message_.ptr_ =
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (gtest_ar.message_.ptr_[3]._M_string_length + (long)orig * 8);
        local_128 = (void *)0x0;
        testing::internal::CmpHelperNE<decltype(nullptr),aiCamera_const*>
                  ((internal *)local_120,"nullptr","orig",&local_128,
                   (aiCamera **)&gtest_ar_2.message_);
        bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
        if (!bVar5) {
          testing::Message::Message(&local_130);
          pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&imported,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                     ,0x5a,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&imported,&local_130);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&imported);
          testing::Message::~Message(&local_130);
        }
        gtest_ar_.message_.ptr_._5_3_ = 0;
        gtest_ar_.message_.ptr_._4_1_ = !bVar5;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
        if (gtest_ar_.message_.ptr_._4_4_ != 0) goto LAB_004e3b76;
        fVar1 = *(float *)&gtest_ar_2.message_.ptr_[0x21]._M_string_length;
        pfVar10 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                            (&orifClipPlaneNear,(size_t)orig);
        *pfVar10 = fVar1;
        fVar1 = *(float *)((long)&gtest_ar_2.message_.ptr_[0x21]._M_string_length + 4);
        pfVar10 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                            (&orifClipPlaneFar,(size_t)orig);
        *pfVar10 = fVar1;
        fVar1 = *(float *)&gtest_ar_2.message_.ptr_[0x21].field_2;
        pfVar10 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                            ((unique_ptr<float[],_std::default_delete<float[]>_> *)&names,
                             (size_t)orig);
        sVar4 = gtest_ar_2.message_;
        *pfVar10 = fVar1;
        paVar11 = std::unique_ptr<aiString[],_std::default_delete<aiString[]>_>::operator[]
                            ((unique_ptr<aiString[],_std::default_delete<aiString[]>_> *)&pos,
                             (size_t)orig);
        aiString::operator=(paVar11,(aiString *)sVar4.ptr_);
        sVar4 = gtest_ar_2.message_;
        pbVar3 = gtest_ar_2.message_.ptr_ + 0x20;
        paVar12 = std::unique_ptr<aiVector3t<float>[],_std::default_delete<aiVector3t<float>[]>_>::
                  operator[]((unique_ptr<aiVector3t<float>[],_std::default_delete<aiVector3t<float>[]>_>
                              *)&i,(size_t)orig);
        uVar2 = *(undefined8 *)&pbVar3->field_0x4;
        paVar12->x = (float)(int)uVar2;
        paVar12->y = (float)(int)((ulong)uVar2 >> 0x20);
        paVar12->z = *(float *)((long)&sVar4.ptr_[0x20]._M_string_length + 4);
      }
      gtest_ar_3.message_.ptr_ =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           Assimp::Importer::ReadFile((this->super_ColladaExportCamera).im,"cameraExp.dae",0x400);
      local_158 = (void *)0x0;
      testing::internal::CmpHelperNE<decltype(nullptr),aiScene_const*>
                ((internal *)local_150,"nullptr","imported",&local_158,
                 (aiScene **)&gtest_ar_3.message_);
      bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_150);
      if (!bVar5) {
        testing::Message::Message(&local_160);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_150);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__1.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                   ,100,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_160)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
        testing::Message::~Message(&local_160);
      }
      gtest_ar_.message_.ptr_._5_3_ = 0;
      gtest_ar_.message_.ptr_._4_1_ = !bVar5;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_150);
      if (gtest_ar_.message_.ptr_._4_4_ == 0) {
        local_179 = aiScene::HasCameras((aiScene *)gtest_ar_3.message_.ptr_);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_178,&local_179,(type *)0x0);
        bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_178);
        if (!bVar5) {
          testing::Message::Message(&local_188);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar_4.message_,(internal *)local_178,
                     (AssertionResult *)"imported->HasCameras()","false","true",pcVar6);
          pcVar7 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_190,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                     ,0x66,pcVar7);
          testing::internal::AssertHelper::operator=(&local_190,&local_188);
          testing::internal::AssertHelper::~AssertHelper(&local_190);
          std::__cxx11::string::~string((string *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_188);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_178);
        testing::internal::EqHelper<false>::Compare<unsigned_int,unsigned_int>
                  ((EqHelper<false> *)local_1c0,"origNumCams","imported->mNumCameras",
                   (uint *)((long)&origFOV._M_t.
                                   super___uniq_ptr_impl<float,_std::default_delete<float[]>_>._M_t.
                                   super__Tuple_impl<0UL,_float_*,_std::default_delete<float[]>_>.
                                   super__Head_base<0UL,_float_*,_false>._M_head_impl + 4),
                   (uint *)(gtest_ar_3.message_.ptr_ + 3));
        bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
        if (!bVar5) {
          testing::Message::Message(&local_1c8);
          pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_1c0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&i_1,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                     ,0x67,pcVar7);
          testing::internal::AssertHelper::operator=((AssertHelper *)&i_1,&local_1c8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&i_1);
          testing::Message::~Message(&local_1c8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
        for (read = (aiCamera *)0x0;
            read < (aiCamera *)(ulong)*(uint *)(gtest_ar_3.message_.ptr_ + 3);
            read = (aiCamera *)((long)&(read->mName).length + 1)) {
          gtest_ar__2.message_.ptr_ =
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (gtest_ar_3.message_.ptr_[3]._M_string_length + (long)read * 8);
          paVar11 = std::unique_ptr<aiString[],_std::default_delete<aiString[]>_>::operator[]
                              ((unique_ptr<aiString[],_std::default_delete<aiString[]>_> *)&pos,
                               (size_t)read);
          local_1f1 = aiString::operator==(paVar11,(aiString *)gtest_ar__2.message_.ptr_);
          testing::AssertionResult::AssertionResult<bool>
                    ((AssertionResult *)local_1f0,&local_1f1,(type *)0x0);
          bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
          if (!bVar5) {
            testing::Message::Message(&local_200);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar_5.message_,(internal *)local_1f0,
                       (AssertionResult *)"names[ i ] == read->mName","false","true",pcVar6);
            pcVar7 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_208,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                       ,0x6c,pcVar7);
            testing::internal::AssertHelper::operator=(&local_208,&local_200);
            testing::internal::AssertHelper::~AssertHelper(&local_208);
            std::__cxx11::string::~string((string *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_200);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
          pfVar10 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                              (&orifClipPlaneNear,(size_t)read);
          testing::internal::DoubleNearPredFormat
                    ((internal *)local_238,"origFOV[ i ]","read->mHorizontalFOV","0.0001f",
                     (double)*pfVar10,
                     (double)*(float *)&gtest_ar__2.message_.ptr_[0x21]._M_string_length,
                     9.999999747378752e-05);
          bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
          if (!bVar5) {
            testing::Message::Message(&local_240);
            pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                       ,0x6d,pcVar7);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_6.message_,&local_240);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
            testing::Message::~Message(&local_240);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
          pfVar10 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                              (&orifClipPlaneFar,(size_t)read);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_258,"orifClipPlaneNear[ i ]","read->mClipPlaneNear",*pfVar10,
                     *(float *)((long)&gtest_ar__2.message_.ptr_[0x21]._M_string_length + 4));
          bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_258);
          if (!bVar5) {
            testing::Message::Message(&local_260);
            pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_258);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                       ,0x6e,pcVar7);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_7.message_,&local_260);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
            testing::Message::~Message(&local_260);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_258);
          pfVar10 = std::unique_ptr<float[],_std::default_delete<float[]>_>::operator[]
                              ((unique_ptr<float[],_std::default_delete<float[]>_> *)&names,
                               (size_t)read);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_278,"orifClipPlaneFar[ i ]","read->mClipPlaneFar",*pfVar10,
                     *(float *)&gtest_ar__2.message_.ptr_[0x21].field_2);
          bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_278);
          if (!bVar5) {
            testing::Message::Message(&local_280);
            pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_278);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                       ,0x6f,pcVar7);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_8.message_,&local_280);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
            testing::Message::~Message(&local_280);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_278);
          paVar12 = std::unique_ptr<aiVector3t<float>[],_std::default_delete<aiVector3t<float>[]>_>
                    ::operator[]((unique_ptr<aiVector3t<float>[],_std::default_delete<aiVector3t<float>[]>_>
                                  *)&i,(size_t)read);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_298,"pos[ i ].x","read->mPosition.x",paVar12->x,
                     *(float *)&gtest_ar__2.message_.ptr_[0x20].field_0x4);
          bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_298);
          if (!bVar5) {
            testing::Message::Message(&local_2a0);
            pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_298);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_9.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                       ,0x71,pcVar7);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_9.message_,&local_2a0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_9.message_);
            testing::Message::~Message(&local_2a0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_298);
          paVar12 = std::unique_ptr<aiVector3t<float>[],_std::default_delete<aiVector3t<float>[]>_>
                    ::operator[]((unique_ptr<aiVector3t<float>[],_std::default_delete<aiVector3t<float>[]>_>
                                  *)&i,(size_t)read);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_2b8,"pos[ i ].y","read->mPosition.y",paVar12->y,
                     *(float *)&gtest_ar__2.message_.ptr_[0x20]._M_string_length);
          bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
          if (!bVar5) {
            testing::Message::Message(&local_2c0);
            pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_10.message_,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                       ,0x72,pcVar7);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_10.message_,&local_2c0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_10.message_);
            testing::Message::~Message(&local_2c0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
          paVar12 = std::unique_ptr<aiVector3t<float>[],_std::default_delete<aiVector3t<float>[]>_>
                    ::operator[]((unique_ptr<aiVector3t<float>[],_std::default_delete<aiVector3t<float>[]>_>
                                  *)&i,(size_t)read);
          testing::internal::CmpHelperFloatingPointEQ<float>
                    ((internal *)local_2d8,"pos[ i ].z","read->mPosition.z",paVar12->z,
                     *(float *)((long)&gtest_ar__2.message_.ptr_[0x20]._M_string_length + 4));
          bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
          if (!bVar5) {
            testing::Message::Message(&local_2e0);
            pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
            testing::internal::AssertHelper::AssertHelper
                      (&local_2e8,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utColladaExportCamera.cpp"
                       ,0x73,pcVar7);
            testing::internal::AssertHelper::operator=(&local_2e8,&local_2e0);
            testing::internal::AssertHelper::~AssertHelper(&local_2e8);
            testing::Message::~Message(&local_2e0);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
        }
        gtest_ar_.message_.ptr_._4_4_ = 0;
      }
LAB_004e3b76:
      std::unique_ptr<aiVector3t<float>[],_std::default_delete<aiVector3t<float>[]>_>::~unique_ptr
                ((unique_ptr<aiVector3t<float>[],_std::default_delete<aiVector3t<float>[]>_> *)&i);
      std::unique_ptr<aiString[],_std::default_delete<aiString[]>_>::~unique_ptr
                ((unique_ptr<aiString[],_std::default_delete<aiString[]>_> *)&pos);
      std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
                ((unique_ptr<float[],_std::default_delete<float[]>_> *)&names);
      std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&orifClipPlaneFar);
      std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr(&orifClipPlaneNear);
    }
  }
  return;
}

Assistant:

TEST_F(ColladaExportCamera, testExportCamera) {
    const char* file = "cameraExp.dae";

    const aiScene* pTest = im->ReadFile(ASSIMP_TEST_MODELS_DIR "/Collada/cameras.dae", aiProcess_ValidateDataStructure);
    ASSERT_NE( nullptr, pTest );
    ASSERT_TRUE(pTest->HasCameras());


    EXPECT_EQ( AI_SUCCESS, ex->Export(pTest,"collada",file));
    const unsigned int origNumCams( pTest->mNumCameras );
    std::unique_ptr<float[]> origFOV( new float[ origNumCams ] );
    std::unique_ptr<float[]> orifClipPlaneNear( new float[ origNumCams ] );
    std::unique_ptr<float[]> orifClipPlaneFar( new float[ origNumCams ] );
    std::unique_ptr<aiString[]> names( new aiString[ origNumCams ] );
    std::unique_ptr<aiVector3D[]> pos( new aiVector3D[ origNumCams ] );
    for (size_t i = 0; i < origNumCams; i++) {
        const aiCamera *orig = pTest->mCameras[ i ];
        ASSERT_NE(nullptr, orig );

        origFOV[ i ] = orig->mHorizontalFOV;
        orifClipPlaneNear[ i ] = orig->mClipPlaneNear;
        orifClipPlaneFar[ i ] = orig->mClipPlaneFar;
        names[ i ] = orig->mName;
        pos[ i ] = orig->mPosition;
    }
    const aiScene* imported = im->ReadFile(file, aiProcess_ValidateDataStructure);

    ASSERT_NE(nullptr, imported );

    EXPECT_TRUE( imported->HasCameras() );
    EXPECT_EQ( origNumCams, imported->mNumCameras );

    for(size_t i=0; i< imported->mNumCameras;i++){
        const aiCamera *read = imported->mCameras[ i ];

        EXPECT_TRUE( names[ i ] == read->mName );
        EXPECT_NEAR( origFOV[ i ],read->mHorizontalFOV, 0.0001f );
        EXPECT_FLOAT_EQ( orifClipPlaneNear[ i ], read->mClipPlaneNear);
        EXPECT_FLOAT_EQ( orifClipPlaneFar[ i ], read->mClipPlaneFar);

        EXPECT_FLOAT_EQ( pos[ i ].x,read->mPosition.x);
        EXPECT_FLOAT_EQ( pos[ i ].y,read->mPosition.y);
        EXPECT_FLOAT_EQ( pos[ i ].z,read->mPosition.z);
    }
}